

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O2

sysbvm_bitflags_t sysbvm_function_getFlags(sysbvm_context_t *context,sysbvm_tuple_t function)

{
  ulong uVar1;
  _Bool _Var2;
  sysbvm_bitflags_t sVar3;
  
  _Var2 = sysbvm_tuple_isFunction(context,function);
  if (_Var2) {
    uVar1 = (context->heap).nextGCSizeThreshold;
    if (uVar1 == 0 || (uVar1 & 0xf) != 0) {
      sVar3 = (long)uVar1 >> 4;
    }
    else {
      sVar3 = *(sysbvm_bitflags_t *)(uVar1 + 0x10);
    }
  }
  else {
    sVar3 = 0;
  }
  return sVar3;
}

Assistant:

SYSBVM_INLINE sysbvm_bitflags_t sysbvm_function_getFlags(sysbvm_context_t *context, sysbvm_tuple_t function)
{
    return sysbvm_tuple_isFunction(context, function) ? sysbvm_tuple_bitflags_decode(((sysbvm_function_t*)function)->flags) : 0;
}